

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

RegExp * re2c::mkAlt(RegExp *e1,RegExp *e2)

{
  long lVar1;
  MatchOp *pMVar2;
  MatchOp *pMVar3;
  MatchOp *pMVar4;
  Range *m;
  RegExp *pRVar5;
  
  if (e1 == (RegExp *)0x0) {
    pMVar3 = (MatchOp *)0x0;
LAB_0013b065:
    if (pMVar3 != (MatchOp *)0x0) {
      e1 = (RegExp *)0x0;
    }
  }
  else {
    lVar1 = __dynamic_cast(e1,&RegExp::typeinfo,&AltOp::typeinfo,0);
    if (lVar1 == 0) {
      pMVar3 = (MatchOp *)__dynamic_cast(e1,&RegExp::typeinfo,&MatchOp::typeinfo,0);
      goto LAB_0013b065;
    }
    if (*(long *)(lVar1 + 8) == 0) {
      pMVar3 = (MatchOp *)0x0;
    }
    else {
      pMVar2 = (MatchOp *)
               __dynamic_cast(*(long *)(lVar1 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
      pMVar3 = (MatchOp *)0x0;
      if (pMVar2 != (MatchOp *)0x0) {
        e1 = *(RegExp **)(lVar1 + 0x10);
        pMVar3 = pMVar2;
      }
    }
  }
  if (e2 == (RegExp *)0x0) {
    pMVar2 = (MatchOp *)0x0;
  }
  else {
    lVar1 = __dynamic_cast(e2,&RegExp::typeinfo,&AltOp::typeinfo,0);
    if (lVar1 != 0) {
      if (*(long *)(lVar1 + 8) == 0) {
        pMVar2 = (MatchOp *)0x0;
      }
      else {
        pMVar4 = (MatchOp *)
                 __dynamic_cast(*(long *)(lVar1 + 8),&RegExp::typeinfo,&MatchOp::typeinfo,0);
        pMVar2 = (MatchOp *)0x0;
        if (pMVar4 != (MatchOp *)0x0) {
          e2 = *(RegExp **)(lVar1 + 0x10);
          pMVar2 = pMVar4;
        }
      }
      goto LAB_0013b0ef;
    }
    pMVar2 = (MatchOp *)__dynamic_cast(e2,&RegExp::typeinfo,&MatchOp::typeinfo,0);
  }
  if (pMVar2 != (MatchOp *)0x0) {
    e2 = (RegExp *)0x0;
  }
LAB_0013b0ef:
  pMVar4 = pMVar2;
  if ((pMVar3 != (MatchOp *)0x0) && (pMVar4 = pMVar3, pMVar2 != (MatchOp *)0x0)) {
    pMVar4 = (MatchOp *)operator_new(0x10);
    m = Range::add(pMVar3->match,pMVar2->match);
    MatchOp::MatchOp(pMVar4,m);
  }
  pRVar5 = doAlt(e1,e2);
  pRVar5 = doAlt(&pMVar4->super_RegExp,pRVar5);
  return pRVar5;
}

Assistant:

RegExp * mkAlt (RegExp * e1, RegExp * e2)
{
	AltOp * a;
	MatchOp * m1;
	MatchOp * m2;

	a = dynamic_cast<AltOp*> (e1);
	if (a != NULL)
	{
		m1 = dynamic_cast<MatchOp*> (a->exp1);
		if (m1 != NULL)
		{
			e1 = a->exp2;
		}
	}
	else
	{
		m1 = dynamic_cast<MatchOp*> (e1);
		if (m1 != NULL)
		{
			e1 = NULL;
		}
	}
	a = dynamic_cast<AltOp*> (e2);
	if (a != NULL)
	{
		m2 = dynamic_cast<MatchOp*> (a->exp1);
		if (m2 != NULL)
		{
			e2 = a->exp2;
		}
	}
	else
	{
		m2 = dynamic_cast<MatchOp*> (e2);
		if (m2 != NULL)
		{
			e2 = NULL;
		}
	}

	return doAlt (merge (m1, m2), doAlt (e1, e2));
}